

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

string * __thiscall
cmOSXBundleGenerator::InitMacOSXContentDirectory
          (string *__return_storage_ptr__,cmOSXBundleGenerator *this,char *pkgloc,string *config)

{
  string loc;
  char *pkgloc_local;
  allocator<char> local_40 [32];
  
  pkgloc_local = pkgloc;
  cmGeneratorTarget::GetMacContentDirectory(&loc,this->GT,config,RuntimeBinaryArtifact);
  local_40[0] = (allocator<char>)0x2f;
  cmStrCat<std::__cxx11::string,char,char_const*&>
            (__return_storage_ptr__,&loc,(char *)local_40,&pkgloc_local);
  std::__cxx11::string::~string((string *)&loc);
  cmsys::SystemTools::MakeDirectory(__return_storage_ptr__,(mode_t *)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&loc,pkgloc_local,local_40);
  std::__cxx11::string::find((char)&loc,0x2f);
  std::__cxx11::string::substr((ulong)local_40,(ulong)&loc);
  std::__cxx11::string::operator=((string *)&loc,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this->MacContentFolders,&loc);
  std::__cxx11::string::~string((string *)&loc);
  return __return_storage_ptr__;
}

Assistant:

std::string cmOSXBundleGenerator::InitMacOSXContentDirectory(
  const char* pkgloc, const std::string& config)
{
  // Construct the full path to the content subdirectory.

  std::string macdir = cmStrCat(this->GT->GetMacContentDirectory(
                                  config, cmStateEnums::RuntimeBinaryArtifact),
                                '/', pkgloc);
  cmSystemTools::MakeDirectory(macdir);

  // Record use of this content location.  Only the first level
  // directory is needed.
  {
    std::string loc = pkgloc;
    loc = loc.substr(0, loc.find('/'));
    this->MacContentFolders->insert(loc);
  }

  return macdir;
}